

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseExprList(WastParser *this,ExprList *exprs)

{
  Expr *pEVar1;
  Expr *pEVar2;
  Expr *pEVar3;
  bool bVar4;
  Result RVar5;
  Expr *pEVar6;
  Enum EVar7;
  iterator pos;
  ExprList new_exprs;
  ExprList local_58;
  _Head_base<0UL,_wabt::Expr_*,_false> local_38;
  
  local_58.first_ = (Expr *)0x0;
  local_58.last_ = (Expr *)0x0;
  local_58.size_ = 0;
  bVar4 = PeekMatchExpr(this);
  if (bVar4) {
    do {
      RVar5 = ParseExpr(this,&local_58);
      pEVar6 = local_58.first_;
      if (RVar5.enum_ == Ok) {
        while (pEVar6 != (Expr *)0x0) {
          if (local_58.size_ == 0) {
            __assert_fail("!empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                          ,0x221,
                          "std::unique_ptr<T> wabt::intrusive_list<wabt::Expr>::extract(iterator) [T = wabt::Expr]"
                         );
          }
          pEVar3 = (pEVar6->super_intrusive_list_base<wabt::Expr>).next_;
          if (local_58.first_ == local_58.last_) {
            local_58.first_ = (Expr *)0x0;
            local_58.last_ = (Expr *)0x0;
            pEVar1 = local_58.last_;
          }
          else {
            pEVar1 = (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_;
            pEVar2 = pEVar3;
            if (pEVar1 != (Expr *)0x0) {
              (pEVar1->super_intrusive_list_base<wabt::Expr>).next_ = pEVar3;
              pEVar2 = local_58.first_;
            }
            local_58.first_ = pEVar2;
            pEVar2 = (pEVar6->super_intrusive_list_base<wabt::Expr>).next_;
            if (pEVar2 != (Expr *)0x0) {
              (pEVar2->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar1;
              pEVar1 = local_58.last_;
            }
          }
          local_58.last_ = pEVar1;
          local_58.size_ = local_58.size_ - 1;
          (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
          (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
          pos.node_ = (Expr *)0x0;
          pos.list_ = exprs;
          local_38._M_head_impl = pEVar6;
          intrusive_list<wabt::Expr>::insert
                    (exprs,pos,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_38
                    );
          if (local_38._M_head_impl != (Expr *)0x0) {
            (*(local_38._M_head_impl)->_vptr_Expr[1])();
          }
          local_38._M_head_impl = (Expr *)0x0;
          pEVar6 = pEVar3;
        }
      }
      else {
        RVar5 = Synchronize(this,anon_unknown_1::IsExpr);
        if (RVar5.enum_ == Error) {
          EVar7 = Error;
          pEVar6 = local_58.first_;
          goto joined_r0x00141dc6;
        }
      }
      bVar4 = PeekMatchExpr(this);
    } while (bVar4);
  }
  EVar7 = Ok;
  pEVar6 = local_58.first_;
joined_r0x00141dc6:
  while (pEVar6 != (Expr *)0x0) {
    pEVar3 = (pEVar6->super_intrusive_list_base<wabt::Expr>).next_;
    (*pEVar6->_vptr_Expr[1])();
    pEVar6 = pEVar3;
  }
  return (Result)EVar7;
}

Assistant:

Result WastParser::ParseExprList(ExprList* exprs) {
  WABT_TRACE(ParseExprList);
  ExprList new_exprs;
  while (PeekMatchExpr()) {
    if (Succeeded(ParseExpr(&new_exprs))) {
      exprs->splice(exprs->end(), new_exprs);
    } else {
      CHECK_RESULT(Synchronize(IsExpr));
    }
  }
  return Result::Ok;
}